

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ColumnDefault(Vdbe *v,Table *pTab,int i,int iReg)

{
  u8 enc_00;
  sqlite3 *psVar1;
  Expr *pExpr;
  sqlite3_value *psStack_30;
  u8 enc;
  sqlite3_value *pValue;
  Column *pCol;
  int iReg_local;
  int i_local;
  Table *pTab_local;
  Vdbe *v_local;
  
  pValue = (sqlite3_value *)(pTab->aCol + i);
  pCol._0_4_ = iReg;
  pCol._4_4_ = i;
  _iReg_local = pTab;
  pTab_local = (Table *)v;
  if (*(u16 *)((long)&pValue->z + 4) != 0) {
    psStack_30 = (sqlite3_value *)0x0;
    psVar1 = sqlite3VdbeDb(v);
    enc_00 = psVar1->enc;
    psVar1 = sqlite3VdbeDb((Vdbe *)pTab_local);
    pExpr = sqlite3ColumnExpr(_iReg_local,(Column *)pValue);
    sqlite3ValueFromExpr(psVar1,pExpr,enc_00,*(u8 *)((long)&pValue->z + 1),&stack0xffffffffffffffd0)
    ;
    if (psStack_30 != (sqlite3_value *)0x0) {
      sqlite3VdbeAppendP4((Vdbe *)pTab_local,psStack_30,-10);
    }
  }
  if ((*(char *)((long)&pValue->z + 1) == 'E') && (_iReg_local->eTabType != '\x01')) {
    sqlite3VdbeAddOp1((Vdbe *)pTab_local,0x57,(int)pCol);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnDefault(Vdbe *v, Table *pTab, int i, int iReg){
  Column *pCol;
  assert( pTab!=0 );
  assert( pTab->nCol>i );
  pCol = &pTab->aCol[i];
  if( pCol->iDflt ){
    sqlite3_value *pValue = 0;
    u8 enc = ENC(sqlite3VdbeDb(v));
    assert( !IsView(pTab) );
    VdbeComment((v, "%s.%s", pTab->zName, pCol->zCnName));
    assert( i<pTab->nCol );
    sqlite3ValueFromExpr(sqlite3VdbeDb(v),
                         sqlite3ColumnExpr(pTab,pCol), enc,
                         pCol->affinity, &pValue);
    if( pValue ){
      sqlite3VdbeAppendP4(v, pValue, P4_MEM);
    }
  }
#ifndef SQLITE_OMIT_FLOATING_POINT
  if( pCol->affinity==SQLITE_AFF_REAL && !IsVirtual(pTab) ){
    sqlite3VdbeAddOp1(v, OP_RealAffinity, iReg);
  }
#endif
}